

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t generic_unpack_deep(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint uVar2;
  exr_coding_channel_info_t *peVar3;
  uint16_t uVar4;
  float fVar5;
  int iVar6;
  int x;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int32_t *piVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  float *pfVar18;
  long lVar19;
  int iVar20;
  void *pvVar21;
  
  pvVar21 = decode->unpacked_buffer;
  piVar14 = decode->sample_count_table;
  uVar2 = (decode->chunk).width;
  uVar15 = 0;
  if (0 < (int)uVar2) {
    uVar15 = (ulong)uVar2;
  }
  iVar7 = (decode->chunk).height;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  iVar9 = 0;
  lVar16 = 0;
  do {
    if (iVar9 == iVar7) {
      return 0;
    }
    uVar17 = 0;
    while( true ) {
      uVar8 = uVar17;
      if ((long)decode->channel_count <= (long)uVar8) break;
      peVar3 = decode->channels;
      uVar17 = uVar8 + 1;
      uVar12 = (ulong)(uint)(int)decode->channel_count;
      cVar1 = peVar3[uVar8].bytes_per_element;
      if (peVar3[uVar8].field_12.decode_to_ptr == (uint8_t *)0x0) {
        if ((decode->decode_flags & 1) == 0) {
          iVar6 = piVar14[(long)(int)uVar2 + -1];
        }
        else {
          iVar6 = 0;
          for (uVar8 = 0; uVar15 != uVar8; uVar8 = uVar8 + 1) {
            iVar6 = iVar6 + piVar14[uVar8];
          }
        }
        pvVar21 = (void *)((long)pvVar21 + (long)(int)cVar1 * (long)iVar6);
        lVar13 = (long)iVar6;
        if (uVar17 != uVar12) {
          lVar13 = 0;
        }
        lVar16 = lVar16 + lVar13;
      }
      else {
        lVar13 = (long)peVar3[uVar8].user_bytes_per_element;
        pfVar18 = (float *)(peVar3[uVar8].field_12.decode_to_ptr + lVar16 * lVar13);
        iVar6 = 0;
        for (uVar10 = 0; uVar10 != uVar15; uVar10 = uVar10 + 1) {
          iVar20 = iVar6;
          iVar11 = piVar14[uVar10];
          if ((decode->decode_flags & 1) != 0) {
            iVar20 = 0;
            iVar11 = iVar6;
          }
          iVar6 = iVar11;
          iVar20 = piVar14[uVar10] - iVar20;
          uVar4 = peVar3[uVar8].data_type;
          if (uVar4 == 0) {
            uVar4 = peVar3[uVar8].user_data_type;
            if (uVar4 == 2) {
              iVar11 = 0;
              if (0 < iVar20) {
                iVar11 = iVar20;
              }
              for (lVar19 = 0; iVar11 != (int)lVar19; lVar19 = lVar19 + 1) {
                *pfVar18 = (float)*(uint *)((long)pvVar21 + lVar19 * 4);
                pfVar18 = (float *)((long)pfVar18 + lVar13);
              }
            }
            else if (uVar4 == 1) {
              iVar11 = 0;
              if (0 < iVar20) {
                iVar11 = iVar20;
              }
              for (lVar19 = 0; iVar11 != (int)lVar19; lVar19 = lVar19 + 1) {
                uVar4 = uint_to_half(*(uint32_t *)((long)pvVar21 + lVar19 * 4));
                *(uint16_t *)pfVar18 = uVar4;
                pfVar18 = (float *)((long)pfVar18 + lVar13);
              }
            }
            else {
              if (uVar4 != 0) {
                return 3;
              }
              iVar11 = 0;
              if (0 < iVar20) {
                iVar11 = iVar20;
              }
              for (lVar19 = 0; iVar11 != (int)lVar19; lVar19 = lVar19 + 1) {
                *pfVar18 = *(float *)((long)pvVar21 + lVar19 * 4);
                pfVar18 = (float *)((long)pfVar18 + lVar13);
              }
            }
          }
          else if (uVar4 == 2) {
            uVar4 = peVar3[uVar8].user_data_type;
            if (uVar4 == 2) {
              iVar11 = 0;
              if (0 < iVar20) {
                iVar11 = iVar20;
              }
              for (lVar19 = 0; iVar11 != (int)lVar19; lVar19 = lVar19 + 1) {
                *pfVar18 = *(float *)((long)pvVar21 + lVar19 * 4);
                pfVar18 = (float *)((long)pfVar18 + lVar13);
              }
            }
            else if (uVar4 == 1) {
              iVar11 = 0;
              if (0 < iVar20) {
                iVar11 = iVar20;
              }
              for (lVar19 = 0; iVar11 != (int)lVar19; lVar19 = lVar19 + 1) {
                uVar4 = float_to_half(*(float *)((long)pvVar21 + lVar19 * 4));
                *(uint16_t *)pfVar18 = uVar4;
                pfVar18 = (float *)((long)pfVar18 + lVar13);
              }
            }
            else {
              if (uVar4 != 0) {
                return 3;
              }
              iVar11 = 0;
              if (0 < iVar20) {
                iVar11 = iVar20;
              }
              for (lVar19 = 0; iVar11 != (int)lVar19; lVar19 = lVar19 + 1) {
                fVar5 = (float)float_to_uint_int(*(uint32_t *)((long)pvVar21 + lVar19 * 4));
                *pfVar18 = fVar5;
                pfVar18 = (float *)((long)pfVar18 + lVar13);
              }
            }
          }
          else {
            if (uVar4 != 1) {
              return 3;
            }
            uVar4 = peVar3[uVar8].user_data_type;
            if (uVar4 == 2) {
              iVar11 = 0;
              if (0 < iVar20) {
                iVar11 = iVar20;
              }
              for (lVar19 = 0; iVar11 != (int)lVar19; lVar19 = lVar19 + 1) {
                fVar5 = half_to_float(*(uint16_t *)((long)pvVar21 + lVar19 * 2));
                *pfVar18 = fVar5;
                pfVar18 = (float *)((long)pfVar18 + lVar13);
              }
            }
            else if (uVar4 == 1) {
              iVar11 = 0;
              if (0 < iVar20) {
                iVar11 = iVar20;
              }
              for (lVar19 = 0; iVar11 != (int)lVar19; lVar19 = lVar19 + 1) {
                *(uint16_t *)pfVar18 = *(uint16_t *)((long)pvVar21 + lVar19 * 2);
                pfVar18 = (float *)((long)pfVar18 + lVar13);
              }
            }
            else {
              if (uVar4 != 0) {
                return 3;
              }
              iVar11 = 0;
              if (0 < iVar20) {
                iVar11 = iVar20;
              }
              for (lVar19 = 0; iVar11 != (int)lVar19; lVar19 = lVar19 + 1) {
                fVar5 = (float)half_to_uint(*(uint16_t *)((long)pvVar21 + lVar19 * 2));
                *pfVar18 = fVar5;
                pfVar18 = (float *)((long)pfVar18 + lVar13);
              }
            }
          }
          pvVar21 = (void *)((long)pvVar21 + (long)(iVar20 * cVar1));
          lVar19 = (long)iVar20;
          if (uVar17 != uVar12) {
            lVar19 = 0;
          }
          lVar16 = lVar16 + lVar19;
        }
      }
    }
    piVar14 = piVar14 + (int)uVar2;
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack_deep (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = (const uint8_t*) decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    uint8_t*       cdata;
    int            w, h, bpc, ubpc;
    size_t         totsamps = 0;

    w = decode->chunk.width;
    h = decode->chunk.height;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;

            int incr_tot = ((c + 1) == decode->channel_count);

            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            cdata = decc->decode_to_ptr;

            if (!cdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);

                if (incr_tot) totsamps += (size_t) prevsamps;

                continue;
            }
            cdata += totsamps * ((size_t) ubpc);

            for (int x = 0; x < w; ++x)
            {
                int32_t samps = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                UNPACK_SAMPLES (samps)

                srcbuffer += bpc * samps;
                if (incr_tot) totsamps += (size_t) samps;
            }
        }
        sampbuffer += w;
    }

    return EXR_ERR_SUCCESS;
}